

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O0

bool __thiscall lddgraph::run(lddgraph *this)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined1 local_348 [8];
  string dispcmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  allocator<char> local_281;
  string local_280 [8];
  string dotcmd;
  undefined1 local_240 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  alreadyScanned;
  ostream local_218 [8];
  ofstream gvstream;
  lddgraph *this_local;
  
  if (((this->_quiet & 1U) != 0) && ((this->_verbose & 1U) != 0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Incompatible options -q and -V, please choose one.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return false;
  }
  if ((this->_quiet & 1U) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Generating graph");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((this->_verbose & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Writing file ");
    poVar3 = std::operator<<(poVar3,(string *)&this->_gvoutput);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::ofstream(local_218);
  uVar4 = std::__cxx11::string::c_str();
  std::ofstream::open(local_218,uVar4,0x10);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    if ((this->_quiet & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error: Unable to open file ");
      poVar3 = std::operator<<(poVar3,(string *)&this->_gvoutput);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    this_local._7_1_ = false;
    alreadyScanned.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    poVar3 = std::operator<<(local_218,"digraph Dependencies {");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_240);
    std::__cxx11::string::string((string *)(dotcmd.field_2._M_local_buf + 8),(string *)this);
    lddrecurse(this,(string *)((long)&dotcmd.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_240,(ofstream *)local_218);
    std::__cxx11::string::~string((string *)(dotcmd.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(local_218,"}");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
    std::ofstream::close();
    if (((this->_gvmode & 1U) == 0) || ((this->_imgmode & 1U) != 0)) {
      if ((this->_verbose & 1U) != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Writing file ");
        poVar3 = std::operator<<(poVar3,(string *)&this->_imgoutput);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_280,"dot ",&local_281);
      std::allocator<char>::~allocator(&local_281);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&dispcmd.field_2 + 8),"-T",&this->_imgformat);
      std::operator+(&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&dispcmd.field_2 + 8)," -o");
      std::operator+(&local_2e8,&local_308,&this->_imgoutput);
      std::operator+(&local_2c8,&local_2e8," ");
      std::operator+(&local_2a8,&local_2c8,&this->_gvoutput);
      std::__cxx11::string::operator+=(local_280,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)(dispcmd.field_2._M_local_buf + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      system(pcVar5);
      if ((this->_verbose & 1U) != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Deleting file ");
        poVar3 = std::operator<<(poVar3,(string *)&this->_gvoutput);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      if (((this->_gvmode & 1U) != 0) || (bVar2 = removefile(this,&this->_gvoutput), bVar2)) {
        if ((this->_imgmode & 1U) == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_348,"display ",&this->_imgoutput);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          system(pcVar5);
          if ((this->_verbose & 1U) != 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,"Deleting file ");
            poVar3 = std::operator<<(poVar3,(string *)&this->_imgoutput);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          this_local._7_1_ = removefile(this,&this->_imgoutput);
          alreadyScanned.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          std::__cxx11::string::~string((string *)local_348);
        }
        else {
          this_local._7_1_ = true;
          alreadyScanned.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        this_local._7_1_ = false;
        alreadyScanned.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      std::__cxx11::string::~string(local_280);
    }
    else {
      this_local._7_1_ = true;
      alreadyScanned.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_240);
  }
  std::ofstream::~ofstream(local_218);
  return this_local._7_1_;
}

Assistant:

bool run()
    {
      if (_quiet && _verbose)
      {
        cerr << "Incompatible options -q and -V, please choose one." << endl;
        return false;
      }

      if (!_quiet)
        cout << "Generating graph" << endl;
      if (_verbose)
        cout << "Writing file " << _gvoutput << endl;
      ofstream gvstream;
      gvstream.open(_gvoutput.c_str());
      if (!gvstream.is_open())
      {
        if (!_quiet)
          cerr << "Error: Unable to open file " << _gvoutput << endl;
        return false;
      }

      gvstream << "digraph Dependencies {" << endl;

      /* Invokes ldd recursively */
      vector<string> alreadyScanned;
      lddrecurse(_input, alreadyScanned, gvstream);

      gvstream << "}" << endl;
      gvstream.flush();
      gvstream.close();

      /* Graphviz mode */
      if (_gvmode && !_imgmode)
        return true;

      /* Image file generation */
      if (_verbose)
        cout << "Writing file " << _imgoutput << endl;
      string dotcmd = "dot ";
      dotcmd += "-T" + _imgformat + " -o" + _imgoutput + " " + _gvoutput;
      system(dotcmd.c_str());

      /* Graphviz file cleanup */
      if (_verbose)
        cout << "Deleting file " << _gvoutput << endl;
      if (!_gvmode && !removefile(_gvoutput))
        return false;

      /* Image mode */
      if (_imgmode)
        return true;

      /* Image file display */
      string dispcmd = "display " + _imgoutput;
      system(dispcmd.c_str());

      /* Image file cleanup */
      if (_verbose)
        cout << "Deleting file " << _imgoutput << endl;
      return removefile(_imgoutput);
    }